

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# road_network.cpp
# Opt level: O2

bool __thiscall
road_network::in_between(road_network *this,node_type start,node_type stop,node_type q)

{
  deque<node_type,_std::allocator<node_type>_> *this_00;
  node_type node;
  undefined8 uVar1;
  bool bVar2;
  deque<node_type,_std::allocator<node_type>_> *this_01;
  _Map_pointer ppnVar3;
  node_type n;
  vector<node_type,_std::allocator<node_type>_> vec;
  deque<node_type,_std::allocator<node_type>_> queue;
  value_type local_a6;
  node_type local_a5;
  uint local_a4;
  road_network *local_a0;
  undefined1 local_98 [40];
  _Map_pointer local_70;
  _Map_pointer local_50;
  
  local_a5 = stop;
  local_a0 = this;
  bVar2 = are_twins(this,start,q);
  if ((bVar2) || (bVar2 = are_twins(this,stop,q), bVar2)) {
    return false;
  }
  local_a4 = (uint)start;
  bVar2 = are_twins(this,start,stop);
  if (stop == q) {
    return true;
  }
  if (start == q) {
    return true;
  }
  if (bVar2) {
    return true;
  }
  std::_Deque_base<node_type,_std::allocator<node_type>_>::_Deque_base
            ((_Deque_base<node_type,_std::allocator<node_type>_> *)(local_98 + 0x18));
  std::deque<node_type,_std::allocator<node_type>_>::push_back
            ((deque<node_type,_std::allocator<node_type>_> *)(local_98 + 0x18),&local_a5);
  this_00 = (deque<node_type,_std::allocator<node_type>_> *)(local_98 + 0x18);
  do {
    bVar2 = local_50 != local_70;
    if (local_50 == local_70) {
LAB_00159e3c:
      std::_Deque_base<node_type,_std::allocator<node_type>_>::~_Deque_base
                ((_Deque_base<node_type,_std::allocator<node_type>_> *)(local_98 + 0x18));
      return bVar2;
    }
    node = *(node_type *)local_70;
    std::deque<node_type,_std::allocator<node_type>_>::pop_front(this_00);
    if (node == q) goto LAB_00159e3c;
    this_01 = (deque<node_type,_std::allocator<node_type>_> *)local_98;
    get_predecessors((vector<node_type,_std::allocator<node_type>_> *)this_01,local_a0,node);
    uVar1 = local_98._8_8_;
    for (ppnVar3 = (_Map_pointer)local_98._0_8_; ppnVar3 != (_Map_pointer)uVar1;
        ppnVar3 = (_Map_pointer)((long)ppnVar3 + 1)) {
      local_a6 = *(value_type *)ppnVar3;
      this_01 = this_00;
      std::deque<node_type,_std::allocator<node_type>_>::push_back(this_00,&local_a6);
    }
    if ((*(node_type *)local_70 == start) ||
       (bVar2 = are_twins((road_network *)this_01,*(node_type *)local_70,(node_type)local_a4), bVar2
       )) {
      std::_Vector_base<node_type,_std::allocator<node_type>_>::~_Vector_base
                ((_Vector_base<node_type,_std::allocator<node_type>_> *)local_98);
      bVar2 = false;
      goto LAB_00159e3c;
    }
    std::_Vector_base<node_type,_std::allocator<node_type>_>::~_Vector_base
              ((_Vector_base<node_type,_std::allocator<node_type>_> *)local_98);
  } while( true );
}

Assistant:

bool road_network::in_between(node_type start, node_type stop, node_type q)
{
    if(are_twins(start, q) || are_twins(stop, q))
    {
        return false;
    }

    if(are_twins(start, stop) || start == q || stop == q)
    {
        return true;
    }

    std::deque<node_type> queue;
    queue.push_back(stop);

    while(!queue.empty())
    {
        node_type current = queue.front();
        queue.pop_front();

        if (current == q)
        {
            return true;
        }

        std::vector<node_type> vec = get_predecessors(current);
        for(auto n : vec)
        {
            queue.push_back(n);
        }

        if (queue.front() == start || are_twins(queue.front(), start))
        {
            break;
        }
    }
    return false;
}